

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_106462a::TNoContractionPropagator::visitSymbol
          (TNoContractionPropagator *this,TIntermSymbol *node)

{
  int iVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  undefined4 extraout_var;
  long lVar4;
  size_type sVar5;
  ObjectAccessChain new_precise_accesschain;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  new_precise_accesschain._M_dataplus._M_p = (pointer)node;
  sVar2 = std::
          _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&this->accesschain_mapping_->_M_h,(key_type *)&new_precise_accesschain);
  if (sVar2 != 0) {
    local_30._M_dataplus._M_p = (pointer)node;
    pmVar3 = std::__detail::
             _Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this->accesschain_mapping_,(key_type *)&local_30);
    std::__cxx11::string::string((string *)&new_precise_accesschain,(string *)pmVar3);
    if ((this->remained_accesschain_)._M_string_length == 0) {
      iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])(node);
      lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
                        ((long *)CONCAT44(extraout_var,iVar1));
      *(byte *)(lVar4 + 0xc) = *(byte *)(lVar4 + 0xc) | 0x10;
    }
    else {
      std::operator+(&local_30,'/',&this->remained_accesschain_);
      std::__cxx11::string::append((string *)&new_precise_accesschain);
      std::__cxx11::string::_M_dispose();
    }
    sVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&(this->added_precise_object_ids_)._M_h,&new_precise_accesschain);
    if (sVar5 == 0) {
      std::__detail::
      _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)this->precise_objects_,&new_precise_accesschain);
      std::__detail::
      _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&this->added_precise_object_ids_,&new_precise_accesschain);
    }
    std::__cxx11::string::_M_dispose();
    return;
  }
  __assert_fail("accesschain_mapping_.count(node)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                ,0x2ef,
                "virtual void (anonymous namespace)::TNoContractionPropagator::visitSymbol(glslang::TIntermSymbol *)"
               );
}

Assistant:

void visitSymbol(glslang::TIntermSymbol* node) override
    {
        // Symbol nodes are object nodes and should always have an
        // access chain collected before matches with it.
        assert(accesschain_mapping_.count(node));
        ObjectAccessChain new_precise_accesschain = accesschain_mapping_.at(node);
        // If the unused access chain is empty, this symbol node should be
        // marked as 'precise'.  Otherwise, the unused access chain should be
        // appended to the symbol ID to build a new access chain which points to
        // the nested 'precise' object in this symbol object.
        if (remained_accesschain_.empty()) {
            node->getWritableType().getQualifier().noContraction = true;
        } else {
            new_precise_accesschain += ObjectAccesschainDelimiter + remained_accesschain_;
        }
        // Add the new 'precise' access chain to the work list and make sure we
        // don't visit it again.
        if (!added_precise_object_ids_.count(new_precise_accesschain)) {
            precise_objects_.insert(new_precise_accesschain);
            added_precise_object_ids_.insert(new_precise_accesschain);
        }
    }